

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O3

TPZMatrix<double> * __thiscall
TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>::CreateAssemble
          (TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_> *this,
          TPZBaseMatrix *rhs,TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  int64_t size;
  TPZCompMesh *pTVar1;
  int iVar2;
  int iVar3;
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *this_00;
  undefined4 extraout_var;
  TPZSubCompMesh *this_01;
  undefined4 extraout_var_00;
  TPZManVector<int,_10> numelconnected;
  TPZAutoPointer<TPZGuiInterface> local_88;
  int local_7c;
  TPZManVector<int,_10> local_78;
  
  size = (&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fEquationFilter.fNumEq)
         [(ulong)(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fEquationFilter.
                 fIsActive * 4];
  local_7c = 0;
  TPZManVector<int,_10>::TPZManVector(&local_78,size,&local_7c);
  this_00 = (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *)
            operator_new(0x1fb60);
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>::TPZFrontMatrix
            (this_00,size);
  iVar2 = (*(this_00->super_TPZAbstractFrontMatrix<double>).super_TPZMatrix<double>.
            super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x4f])(this_00);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x50))
            ((long *)CONCAT44(extraout_var,iVar2),this->fDecomposeType);
  pTVar1 = (this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh;
  if (pTVar1 != (TPZCompMesh *)0x0) {
    this_01 = (TPZSubCompMesh *)
              __dynamic_cast(pTVar1,&TPZCompMesh::typeinfo,&TPZSubCompMesh::typeinfo,0);
    if (this_01 != (TPZSubCompMesh *)0x0) {
      iVar2 = TPZSubCompMesh::NumberRigidBodyModes(this_01);
      if (0 < iVar2) {
        iVar3 = (*(this_00->super_TPZAbstractFrontMatrix<double>).super_TPZMatrix<double>.
                  super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x4f])(this_00);
        TPZFront<double>::SetNumRigidBodyModes
                  ((TPZFront<double> *)CONCAT44(extraout_var_00,iVar3),iVar2);
      }
    }
  }
  GetNumElConnected(this,&local_78.super_TPZVec<int>);
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>::SetNumElConnected
            (this_00,&local_78.super_TPZVec<int>);
  OrderElement(this);
  local_88 = (TPZAutoPointer<TPZGuiInterface>)guiInterface->fRef;
  LOCK();
  ((local_88.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_88.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  (**(code **)(*(long *)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix + 0x60))
            (this,this_00,rhs);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_88);
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>::FinishWriting
            (this_00);
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>::ReOpen(this_00);
  TPZManVector<int,_10>::~TPZManVector(&local_78);
  return (TPZMatrix<double> *)this_00;
}

Assistant:

TPZMatrix<TVar> * TPZFrontStructMatrix<TFront,TVar,TPar>::CreateAssemble(TPZBaseMatrix &rhs, TPZAutoPointer<TPZGuiInterface> guiInterface){
	TPar::InitCreateAssemble();
    int64_t neq = this->fEquationFilter.NActiveEquations();
	TPZManVector <int> numelconnected(neq,0);
	TPZFrontMatrix<TVar,TPZStackEqnStorage<TVar>, TFront> *mat = new TPZFrontMatrix<TVar,TPZStackEqnStorage<TVar>, TFront>(neq);//(this->fMesh->NEquations());
	
//	TPZFrontMatrix<TVar,TPZFileEqnStorage<TVar>, TFront> *mat = new TPZFrontMatrix<TVar,TPZFileEqnStorage<TVar>, TFront>(neq);
    mat->GetFront().SetDecomposeType(fDecomposeType);
	// if the frontal matrix is applied to a submesh, we assume there may be rigid body modes
	TPZSubCompMesh *subcmesh = dynamic_cast<TPZSubCompMesh *> (this->fMesh);	
	if (subcmesh) {
		int nrigid = subcmesh->NumberRigidBodyModes();
		if (nrigid > 0) {
			mat->GetFront().SetNumRigidBodyModes(nrigid);
			
		}
	}
	
	GetNumElConnected(numelconnected);
	mat->SetNumElConnected(numelconnected);
	
	OrderElement();
	
	Assemble(*mat,rhs,guiInterface);
	
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
        mat->FinishWriting();
        mat->ReOpen();
//		mat->Print("Frontal matrix", sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	
	mat->FinishWriting();
	mat->ReOpen();
	return mat;
}